

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O2

void __thiscall EOServer::Tick(EOServer *this)

{
  unordered_map<IPAddress,_ConnectionLogEntry,_std::hash<IPAddress>,_std::equal_to<IPAddress>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>_>
  *this_00;
  list<Client_*,_std::allocator<Client_*>_> *plVar1;
  World *pWVar2;
  pointer ppCVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Client *this_01;
  mapped_type *pmVar7;
  _Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true> it;
  mapped_type *pmVar8;
  vector<Client_*,_std::allocator<Client_*>_> *pvVar9;
  char *reason;
  _List_node_base *p_Var10;
  pointer ppCVar11;
  EOServer *this_02;
  vector<Client_*,_std::allocator<Client_*>_> *__range2;
  double dVar12;
  double dVar13;
  IPAddress local_6c;
  double local_68;
  IPAddress remote_addr;
  IPAddress local_50;
  
  this_01 = Server::Poll(&this->super_Server);
  if (this_01 != (Client *)0x0) {
    dVar12 = Timer::GetTime();
    remote_addr = Client::GetRemoteAddr(this_01);
    pWVar2 = this->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffb0,"IPReconnectLimit",(allocator<char> *)&local_6c);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar2->config,(key_type *)&stack0xffffffffffffffb0);
    local_68 = util::variant::GetFloat(pmVar7);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    pWVar2 = this->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffb0,"MaxConnectionsPerIP",(allocator<char> *)&local_6c
              );
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar2->config,(key_type *)&stack0xffffffffffffffb0);
    iVar6 = util::variant::GetInt(pmVar7);
    this_02 = (EOServer *)&stack0xffffffffffffffb0;
    std::__cxx11::string::~string((string *)this_02);
    this_00 = &this->connection_log;
    it._M_cur = (__node_type *)&(this->connection_log)._M_h._M_before_begin;
    bVar4 = false;
    do {
      while( true ) {
        it._M_cur = (__node_type *)((it._M_cur)->super__Hash_node_base)._M_nxt;
        if (it._M_cur == (__node_type *)0x0) goto LAB_0013bc66;
        dVar13 = *(double *)((long)it._M_cur + 0x10) + local_68;
        if ((dVar13 < dVar12) && (*(double *)((long)it._M_cur + 0x18) + 30.0 < dVar12)) break;
        this_02 = (EOServer *)((long)it._M_cur + 8);
        bVar5 = IPAddress::operator==((IPAddress *)this_02,&remote_addr);
        bVar4 = (bool)(bVar4 | (dVar12 <= dVar13 && bVar5));
      }
      ClearClientRejections(this_02,(connection_log_iterator)it._M_cur);
      this_02 = (EOServer *)this_00;
      it._M_cur = (__node_type *)
                  std::
                  _Hashtable<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::erase(&this_00->_M_h,(const_iterator)it._M_cur);
    } while (it._M_cur != (__node_type *)0x0);
LAB_0013bc66:
    local_68 = (double)CONCAT44(local_68._4_4_,iVar6);
    plVar1 = &(this->super_Server).clients;
    iVar6 = 0;
    p_Var10 = (_List_node_base *)plVar1;
    while (p_Var10 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var10->_M_next)->
                     _M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 != (_List_node_base *)plVar1) {
      local_50 = Client::GetRemoteAddr((Client *)p_Var10[1]._M_next);
      local_6c = Client::GetRemoteAddr(this_01);
      bVar5 = IPAddress::operator==(&stack0xffffffffffffffb0,&local_6c);
      iVar6 = iVar6 + (uint)bVar5;
    }
    if (bVar4) {
      local_50 = Client::GetRemoteAddr(this_01);
      reason = "reconnecting too fast";
    }
    else {
      if ((local_68._0_4_ == 0) || (iVar6 <= local_68._0_4_)) {
        local_68 = Timer::GetTime();
        pmVar8 = std::__detail::
                 _Map_base<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,&remote_addr);
        pmVar8->last_connection_time = local_68;
        goto LAB_0013bd3c;
      }
      local_50 = Client::GetRemoteAddr(this_01);
      reason = "too many connections from this address";
    }
    RecordClientRejection(this,&stack0xffffffffffffffb0,reason);
    Client::Close(this_01,true);
  }
LAB_0013bd3c:
  pvVar9 = Server::Select(&this->super_Server,0.001);
  if (pvVar9 != (vector<Client_*,_std::allocator<Client_*>_> *)0x0) {
    ppCVar3 = (pvVar9->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar11 = (pvVar9->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
                    super__Vector_impl_data._M_start; ppCVar11 != ppCVar3; ppCVar11 = ppCVar11 + 1)
    {
      EOClient::Tick((EOClient *)*ppCVar11);
    }
    ppCVar11 = (pvVar9->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if ((pvVar9->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppCVar11) {
      (pvVar9->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppCVar11;
    }
  }
  Server::BuryTheDead(&this->super_Server);
  Timer::Tick(&this->world->timer);
  return;
}

Assistant:

void EOServer::Tick()
{
	std::vector<Client *> *active_clients = 0;
	EOClient *newclient = static_cast<EOClient *>(this->Poll());

	if (newclient)
	{
		double now = Timer::GetTime();
		int ip_connections = 0;
		bool throttle = false;
		IPAddress remote_addr = newclient->GetRemoteAddr();

		const double reconnect_limit = double(this->world->config["IPReconnectLimit"]);
		const int max_per_ip = int(this->world->config["MaxConnectionsPerIP"]);

		UTIL_IFOREACH(connection_log, connection)
		{
			double last_connection_time = connection->second.last_connection_time;
			double last_rejection_time = connection->second.last_rejection_time;

			if (last_connection_time + reconnect_limit < now
			 && last_rejection_time + 30.0 < now)
			{
				this->ClearClientRejections(connection);
				connection = connection_log.erase(connection);

				if (connection == connection_log.end())
					break;

				continue;
			}

			if (connection->first == remote_addr
			 && last_connection_time + reconnect_limit >= now)
			{
				throttle = true;
			}
		}

		UTIL_FOREACH(this->clients, client)
		{
			if (client->GetRemoteAddr() == newclient->GetRemoteAddr())
			{
				++ip_connections;
			}
		}

		if (throttle)
		{
			this->RecordClientRejection(newclient->GetRemoteAddr(), "reconnecting too fast");
			newclient->Close(true);
		}
		else if (max_per_ip != 0 && ip_connections > max_per_ip)
		{
			this->RecordClientRejection(newclient->GetRemoteAddr(), "too many connections from this address");
			newclient->Close(true);
		}
		else
		{
			connection_log[remote_addr].last_connection_time = Timer::GetTime();
		}
	}

	try
	{
		active_clients = this->Select(0.001);
	}
	catch (Socket_SelectFailed &e)
	{
		if (errno != EINTR)
			throw;
	}

	if (active_clients)
	{
		UTIL_FOREACH(*active_clients, client)
		{
			EOClient *eoclient = static_cast<EOClient *>(client);
			eoclient->Tick();
		}

		active_clients->clear();
	}

	this->BuryTheDead();

	this->world->timer.Tick();
}